

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void inplace_flip_container(roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,uint16_t lb_end)

{
  uint i;
  int iVar1;
  container_t *pcVar2;
  uint8_t ctype_out;
  uint8_t local_29;
  
  i = ra_get_index(x1_arr,hb);
  if ((int)i < 0) {
    pcVar2 = container_range_of_ones((uint)lb_start,lb_end + 1,&local_29);
    ra_insert_new_key_value_at(x1_arr,~i,hb,pcVar2,local_29);
    return;
  }
  pcVar2 = container_inot_range
                     (x1_arr->containers[i & 0xffff],x1_arr->typecodes[i & 0xffff],(uint)lb_start,
                      lb_end + 1,&local_29);
  iVar1 = container_get_cardinality(pcVar2,local_29);
  if (iVar1 != 0) {
    x1_arr->containers[i] = pcVar2;
    x1_arr->typecodes[i] = local_29;
    return;
  }
  container_free(pcVar2,local_29);
  ra_remove_at_index(x1_arr,i);
  return;
}

Assistant:

static void inplace_flip_container(roaring_array_t *x1_arr, uint16_t hb,
                                   uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container = container_inot_range(
            container_to_flip, ctype_in, (uint32_t)lb_start,
            (uint32_t)(lb_end + 1), &ctype_out);
        // if a new container was created, the old one was already freed
        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}